

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.h
# Opt level: O0

bool __thiscall
pbrt::DenselySampledSpectrum::operator==(DenselySampledSpectrum *this,DenselySampledSpectrum *d)

{
  float fVar1;
  size_t sVar2;
  size_t sVar3;
  const_reference pvVar4;
  int *in_RSI;
  int *in_RDI;
  size_t i;
  ulong local_20;
  
  if ((*in_RDI == *in_RSI) && (in_RDI[1] == in_RSI[1])) {
    sVar2 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::size
                      ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)(in_RDI + 2));
    sVar3 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::size
                      ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)(in_RSI + 2));
    if (sVar2 == sVar3) {
      local_20 = 0;
      while( true ) {
        sVar2 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::size
                          ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)(in_RDI + 2));
        if (sVar2 <= local_20) {
          return true;
        }
        pvVar4 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                           ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)(in_RDI + 2),
                            local_20);
        fVar1 = *pvVar4;
        pvVar4 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                           ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)(in_RSI + 2),
                            local_20);
        if ((fVar1 != *pvVar4) || (NAN(fVar1) || NAN(*pvVar4))) break;
        local_20 = local_20 + 1;
      }
      return false;
    }
  }
  return false;
}

Assistant:

PBRT_CPU_GPU
    bool operator==(const DenselySampledSpectrum &d) const {
        if (lambda_min != d.lambda_min || lambda_max != d.lambda_max ||
            values.size() != d.values.size())
            return false;
        for (size_t i = 0; i < values.size(); ++i)
            if (values[i] != d.values[i])
                return false;
        return true;
    }